

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

bool __thiscall
HighsSymmetryDetection::mergeOrbits(HighsSymmetryDetection *this,HighsInt v1,HighsInt v2)

{
  int iVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  reference pvVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HighsInt orbit2;
  HighsInt orbit1;
  undefined4 in_stack_ffffffffffffffe0;
  HighsInt HVar5;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar6;
  undefined1 local_1;
  
  if (in_ESI == in_EDX) {
    local_1 = false;
  }
  else {
    HVar3 = (HighsInt)((ulong)in_RDI >> 0x20);
    HVar2 = getOrbit((HighsSymmetryDetection *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),HVar3);
    HVar3 = getOrbit((HighsSymmetryDetection *)CONCAT44(HVar2,in_stack_ffffffffffffffe0),HVar3);
    if (HVar2 == HVar3) {
      local_1 = false;
    }
    else {
      if (HVar2 < HVar3) {
        iVar6 = HVar2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)HVar3);
        *pvVar4 = HVar2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)HVar3);
        iVar1 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)iVar6);
        *pvVar4 = iVar1 + *pvVar4;
      }
      else {
        HVar5 = HVar3;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)HVar2);
        *pvVar4 = HVar3;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)HVar2);
        iVar1 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)HVar5);
        *pvVar4 = iVar1 + *pvVar4;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool HighsSymmetryDetection::mergeOrbits(HighsInt v1, HighsInt v2) {
  if (v1 == v2) return false;

  HighsInt orbit1 = getOrbit(v1);
  HighsInt orbit2 = getOrbit(v2);

  if (orbit1 == orbit2) return false;

  if (orbit1 < orbit2) {
    orbitPartition[orbit2] = orbit1;
    orbitSize[orbit1] += orbitSize[orbit2];
  } else {
    orbitPartition[orbit1] = orbit2;
    orbitSize[orbit2] += orbitSize[orbit1];
  }

  return true;
}